

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

QRegion __thiscall
QColumnView::visualRegionForSelection(QColumnView *this,QItemSelection *selection)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QAbstractItemModel *pQVar5;
  long in_RDX;
  ulong uVar6;
  QModelIndex *pQVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QRegion lastRegion;
  QRegion firstRegion;
  QRegion local_a0;
  QRegion local_98;
  QModelIndex local_90;
  QModelIndex local_78;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)(in_RDX + 0x10);
  if (uVar1 == 0) {
    pQVar7 = (QModelIndex *)&local_58;
    local_58 = (undefined1 *)0x0;
    puStack_50 = (undefined1 *)0xffffffffffffffff;
  }
  else {
    iVar2 = QPersistentModelIndex::row();
    iVar3 = QPersistentModelIndex::row();
    uVar8 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar8;
    }
    while( true ) {
      if (uVar6 * 0x10 == uVar8) break;
      iVar4 = QPersistentModelIndex::row();
      if (iVar4 <= iVar2) {
        iVar2 = iVar4;
      }
      iVar4 = QPersistentModelIndex::row();
      if (iVar3 <= iVar4) {
        iVar3 = iVar4;
      }
      uVar8 = uVar8 + 0x10;
    }
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = QAbstractItemView::model((QAbstractItemView *)selection);
    QAbstractItemView::rootIndex(&local_78,(QAbstractItemView *)selection);
    iVar4 = iVar3;
    if (iVar2 < iVar3) {
      iVar4 = iVar2;
    }
    if (iVar3 < iVar2) {
      iVar3 = iVar2;
    }
    (**(code **)(*(long *)pQVar5 + 0x60))(&local_58,pQVar5,iVar4,0,&local_78);
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = QAbstractItemView::model((QAbstractItemView *)selection);
    QAbstractItemView::rootIndex(&local_90,(QAbstractItemView *)selection);
    (**(code **)(*(long *)pQVar5 + 0x60))(&local_78,pQVar5,iVar3,0,&local_90);
    if (((((int)local_58 != local_78.r) || (local_58._4_4_ != local_78.c)) ||
        (puStack_50 != (undefined1 *)local_78.i)) || (local_48.ptr != local_78.m.ptr)) {
      local_98.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      local_90._0_16_ =
           (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].super_QArrayData)
                     (selection,&local_58);
      QRegion::QRegion(&local_98,(QRect *)&local_90,Rectangle);
      local_a0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      auVar9 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].super_QArrayData
               )(selection,&local_78);
      local_90._0_16_ = auVar9;
      QRegion::QRegion(&local_a0,(QRect *)&local_90,Rectangle);
      QRegion::united((QRegion *)this);
      QRegion::~QRegion(&local_a0);
      QRegion::~QRegion(&local_98);
      goto LAB_0050aefd;
    }
    local_90._0_16_ =
         (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].super_QArrayData)
                   (selection,&local_58);
    pQVar7 = &local_90;
  }
  QRegion::QRegion((QRegion *)this,(QRect *)pQVar7,Rectangle);
LAB_0050aefd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QRegion)(QRegionData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QColumnView::visualRegionForSelection(const QItemSelection &selection) const
{
    int ranges = selection.size();

    if (ranges == 0)
        return QRect();

    // Note that we use the top and bottom functions of the selection range
    // since the data is stored in rows.
    int firstRow = selection.at(0).top();
    int lastRow = selection.at(0).top();
    for (int i = 0; i < ranges; ++i) {
        firstRow = qMin(firstRow, selection.at(i).top());
        lastRow = qMax(lastRow, selection.at(i).bottom());
    }

    QModelIndex firstIdx = model()->index(qMin(firstRow, lastRow), 0, rootIndex());
    QModelIndex lastIdx = model()->index(qMax(firstRow, lastRow), 0, rootIndex());

    if (firstIdx == lastIdx)
        return visualRect(firstIdx);

    QRegion firstRegion = visualRect(firstIdx);
    QRegion lastRegion = visualRect(lastIdx);
    return firstRegion.united(lastRegion);
}